

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtest.cpp
# Opt level: O0

bool __thiscall hashtest::DoLruHashTest(hashtest *this,char **hash_input,size_t nb_input)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  size_t sVar3;
  hashTestKey *phVar4;
  bool bVar5;
  hashTestKey *retKey_5;
  hashTestKey *retKey_4;
  hashTestKey key_4;
  size_t i_4;
  hashTestKey *retKey_3;
  hashTestKey key_3;
  size_t i_3;
  hashTestKey *retKey_2;
  hashTestKey key_2;
  size_t i_2;
  hashTestKey *retKey_1;
  undefined1 local_100 [7];
  bool stored_1;
  hashTestKey key_1;
  size_t i_1;
  hashTestKey *retKey;
  bool stored;
  undefined1 local_a0 [8];
  hashTestKey key;
  size_t i;
  hashTestKey **pphStack_50;
  bool ret;
  size_t target_size;
  LruHash<hashTestKey> hashTable;
  size_t nb_input_local;
  char **hash_input_local;
  hashtest *this_local;
  
  hashTable.binHash.hashBin = (hashTestKey **)nb_input;
  LruHash<hashTestKey>::LruHash((LruHash<hashTestKey> *)&target_size);
  pphStack_50 = hashTable.binHash.hashBin;
  i._7_1_ = true;
  for (key.MoreRecentKey = (hashTestKey *)0x0;
      i._7_1_ != false && key.MoreRecentKey < hashTable.binHash.hashBin;
      key.MoreRecentKey = (hashTestKey *)((long)&(key.MoreRecentKey)->count + 1)) {
    puVar1 = (uint8_t *)hash_input[(long)key.MoreRecentKey];
    sVar3 = strlen((char *)puVar1);
    hashTestKey::hashTestKey((hashTestKey *)local_a0,puVar1,sVar3,(size_t)key.MoreRecentKey);
    phVar4 = LruHash<hashTestKey>::InsertOrAdd
                       ((LruHash<hashTestKey> *)&target_size,(hashTestKey *)local_a0,true,
                        (bool *)((long)&retKey + 3));
    if (key.MoreRecentKey == (hashTestKey *)0x41) {
      i._7_1_ = LruCheck(this,&target_size);
    }
    if (phVar4 == (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    else if ((retKey._3_1_ & 1) == 0) {
      i._7_1_ = false;
    }
    hashTestKey::~hashTestKey((hashTestKey *)local_a0);
  }
  if ((i._7_1_ != false) &&
     (uVar2 = LruHash<hashTestKey>::GetCount((LruHash<hashTestKey> *)&target_size),
     (hashTestKey **)(ulong)uVar2 != pphStack_50)) {
    i._7_1_ = false;
  }
  if (i._7_1_ != false) {
    i._7_1_ = LruCheck(this,&target_size);
  }
  for (key_1.MoreRecentKey = (hashTestKey *)0x0;
      i._7_1_ != false && key_1.MoreRecentKey < hashTable.binHash.hashBin;
      key_1.MoreRecentKey = (hashTestKey *)((long)&(key_1.MoreRecentKey)->count + 1)) {
    puVar1 = (uint8_t *)hash_input[(long)key_1.MoreRecentKey];
    sVar3 = strlen((char *)puVar1);
    hashTestKey::hashTestKey((hashTestKey *)local_100,puVar1,sVar3,(size_t)key_1.MoreRecentKey);
    phVar4 = LruHash<hashTestKey>::InsertOrAdd
                       ((LruHash<hashTestKey> *)&target_size,(hashTestKey *)local_100,true,
                        (bool *)((long)&retKey_1 + 7));
    if (phVar4 == (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    else if ((retKey_1._7_1_ & 1) == 0) {
      if (phVar4->count != 2) {
        i._7_1_ = false;
      }
    }
    else {
      i._7_1_ = false;
    }
    hashTestKey::~hashTestKey((hashTestKey *)local_100);
  }
  if (i._7_1_ != false) {
    i._7_1_ = LruCheck(this,&target_size);
  }
  for (key_2.MoreRecentKey = (hashTestKey *)0x0;
      i._7_1_ != false && key_2.MoreRecentKey < hashTable.binHash.hashBin;
      key_2.MoreRecentKey = (hashTestKey *)((long)&(key_2.MoreRecentKey)->count + 1)) {
    puVar1 = (uint8_t *)hash_input[(long)key_2.MoreRecentKey];
    sVar3 = strlen((char *)puVar1);
    hashTestKey::hashTestKey((hashTestKey *)&retKey_2,puVar1,sVar3,(size_t)key_2.MoreRecentKey);
    phVar4 = LruHash<hashTestKey>::Retrieve
                       ((LruHash<hashTestKey> *)&target_size,(hashTestKey *)&retKey_2);
    if (phVar4 == (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    else {
      bVar5 = hashTestKey::IsSameKey((hashTestKey *)&retKey_2,phVar4);
      if (bVar5) {
        if (phVar4->count != 2) {
          i._7_1_ = false;
        }
      }
      else {
        i._7_1_ = false;
      }
    }
    hashTestKey::~hashTestKey((hashTestKey *)&retKey_2);
  }
  if (i._7_1_ != false) {
    i._7_1_ = LruCheck(this,&target_size);
  }
  for (key_3.MoreRecentKey = (hashTestKey *)0x0;
      i._7_1_ != false && key_3.MoreRecentKey < (hashTestKey *)0x7;
      key_3.MoreRecentKey = (hashTestKey *)((long)&(key_3.MoreRecentKey)->count + 1)) {
    puVar1 = (uint8_t *)to_not_hash[(long)key_3.MoreRecentKey];
    sVar3 = strlen((char *)puVar1);
    hashTestKey::hashTestKey((hashTestKey *)&retKey_3,puVar1,sVar3,0xff);
    phVar4 = LruHash<hashTestKey>::Retrieve
                       ((LruHash<hashTestKey> *)&target_size,(hashTestKey *)&retKey_3);
    if (phVar4 != (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    hashTestKey::~hashTestKey((hashTestKey *)&retKey_3);
  }
  if (i._7_1_ != false) {
    i._7_1_ = LruCheck(this,&target_size);
  }
  if (i._7_1_ != false) {
    key_4.MoreRecentKey = (hashTestKey *)((ulong)hashTable.binHash.hashBin >> 1);
    puVar1 = (uint8_t *)hash_input[(long)key_4.MoreRecentKey];
    sVar3 = strlen((char *)puVar1);
    hashTestKey::hashTestKey((hashTestKey *)&retKey_4,puVar1,sVar3,(size_t)key_4.MoreRecentKey);
    phVar4 = LruHash<hashTestKey>::Remove
                       ((LruHash<hashTestKey> *)&target_size,(hashTestKey *)&retKey_4);
    if (phVar4 == (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    else {
      if (phVar4 != (hashTestKey *)0x0) {
        hashTestKey::~hashTestKey(phVar4);
        operator_delete(phVar4);
      }
      pphStack_50 = (hashTestKey **)((long)pphStack_50 - 1);
      uVar2 = LruHash<hashTestKey>::GetCount((LruHash<hashTestKey> *)&target_size);
      if ((hashTestKey **)(ulong)uVar2 == pphStack_50) {
        i._7_1_ = LruCheck(this,&target_size);
      }
      else {
        i._7_1_ = false;
      }
    }
    hashTestKey::~hashTestKey((hashTestKey *)&retKey_4);
  }
  while( true ) {
    bVar5 = false;
    if (i._7_1_ != false) {
      uVar2 = LruHash<hashTestKey>::GetCount((LruHash<hashTestKey> *)&target_size);
      bVar5 = uVar2 != 0;
    }
    if (!bVar5) break;
    phVar4 = LruHash<hashTestKey>::RemoveLRU((LruHash<hashTestKey> *)&target_size);
    pphStack_50 = (hashTestKey **)((long)pphStack_50 - 1);
    if (phVar4 == (hashTestKey *)0x0) {
      i._7_1_ = false;
    }
    else {
      if (phVar4 != (hashTestKey *)0x0) {
        hashTestKey::~hashTestKey(phVar4);
        operator_delete(phVar4);
      }
      uVar2 = LruHash<hashTestKey>::GetCount((LruHash<hashTestKey> *)&target_size);
      if ((hashTestKey **)(ulong)uVar2 == pphStack_50) {
        i._7_1_ = LruCheck(this,&target_size);
      }
      else {
        i._7_1_ = false;
      }
    }
  }
  LruHash<hashTestKey>::~LruHash((LruHash<hashTestKey> *)&target_size);
  return i._7_1_;
}

Assistant:

bool hashtest::DoLruHashTest(char const ** hash_input, size_t nb_input)
{
    LruHash<hashTestKey> hashTable;
    size_t target_size = nb_input;
    bool ret = true;

    /* Enter all the data in the input table */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (i == 0x41)
        {
            ret = LruCheck((void*)&hashTable);
        }

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!stored)
        {
            ret = false;
        }
    }

    if (ret && hashTable.GetCount() != target_size)
    {
        ret = false;
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be rewritten without creating new entries */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        bool stored;

        hashTestKey * retKey = hashTable.InsertOrAdd(&key, true, &stored);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (stored)
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the data can be retrieved */
    for (size_t i = 0; ret && i < nb_input; i++)
    {
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else if (!key.IsSameKey(retKey))
        {
            ret = false;
        }
        else if (retKey->count != 2)
        {
            ret = false;
        }
    }

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Verify that all the non-data cannot be retrieved */
    for (size_t i = 0; ret && i < size_to_not_hash; i++)
    {
        hashTestKey key((uint8_t const *)to_not_hash[i], strlen(to_not_hash[i]), 0xFF);

        hashTestKey * retKey = hashTable.Retrieve(&key);

        if (retKey != NULL)
        {
            ret = false;
        }
    }

    /* Check that the LRU Hash order is correct -- should be same as table order */

    if (ret)
    {
        ret = LruCheck((void*)&hashTable);
    }

    /* Delete some random object, then check the table */
    if (ret)
    {
        size_t i = nb_input / 2;
        hashTestKey key((uint8_t const *)hash_input[i], strlen(hash_input[i]), i);
        hashTestKey * retKey = hashTable.Remove(&key);

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;
            target_size--;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }     
        }
    }

    /* Delete the LRU object, then check the table */
    while (ret && hashTable.GetCount() > 0)
    {
        hashTestKey * retKey = hashTable.RemoveLRU();
        target_size--;

        if (retKey == NULL)
        {
            ret = false;
        }
        else
        {
            delete retKey;

            if (hashTable.GetCount() != target_size)
            {
                ret = false;
            }
            else
            {
                ret = LruCheck((void*)&hashTable);
            }
        }
    }
    return ret;
}